

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<std::pair<QString,_QFileInfo>_>::insert
          (QMovableArrayOps<std::pair<QString,_QFileInfo>_> *this,qsizetype i,qsizetype n,
          parameter_type t)

{
  pair<QString,_QFileInfo> **pppVar1;
  qsizetype *pqVar2;
  long in_FS_OFFSET;
  bool bVar3;
  Inserter local_80;
  undefined1 local_58 [40];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  std::pair<QString,_QFileInfo>::pair((pair<QString,_QFileInfo> *)local_58,t);
  bVar3 = (this->super_QGenericArrayOps<std::pair<QString,_QFileInfo>_>).
          super_QArrayDataPointer<std::pair<QString,_QFileInfo>_>.size != 0;
  QArrayDataPointer<std::pair<QString,_QFileInfo>_>::detachAndGrow
            ((QArrayDataPointer<std::pair<QString,_QFileInfo>_> *)this,(uint)(i == 0 && bVar3),n,
             (pair<QString,_QFileInfo> **)0x0,
             (QArrayDataPointer<std::pair<QString,_QFileInfo>_> *)0x0);
  if (i == 0 && bVar3) {
    while (bVar3 = n != 0, n = n + -1, bVar3) {
      std::pair<QString,_QFileInfo>::pair
                ((this->super_QGenericArrayOps<std::pair<QString,_QFileInfo>_>).
                 super_QArrayDataPointer<std::pair<QString,_QFileInfo>_>.ptr + -1,
                 (pair<QString,_QFileInfo> *)local_58);
      pppVar1 = &(this->super_QGenericArrayOps<std::pair<QString,_QFileInfo>_>).
                 super_QArrayDataPointer<std::pair<QString,_QFileInfo>_>.ptr;
      *pppVar1 = *pppVar1 + -1;
      pqVar2 = &(this->super_QGenericArrayOps<std::pair<QString,_QFileInfo>_>).
                super_QArrayDataPointer<std::pair<QString,_QFileInfo>_>.size;
      *pqVar2 = *pqVar2 + 1;
    }
  }
  else {
    Inserter::Inserter(&local_80,(QArrayDataPointer<std::pair<QString,_QFileInfo>_> *)this,i,n);
    Inserter::insertFill(&local_80,(pair<QString,_QFileInfo> *)local_58,n);
    Inserter::~Inserter(&local_80);
  }
  std::pair<QString,_QFileInfo>::~pair((pair<QString,_QFileInfo> *)local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void insert(qsizetype i, qsizetype n, parameter_type t)
    {
        T copy(t);

        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, n, nullptr, nullptr);
        Q_ASSERT((pos == Data::GrowsAtBeginning && this->freeSpaceAtBegin() >= n) ||
                 (pos == Data::GrowsAtEnd && this->freeSpaceAtEnd() >= n));

        if (growsAtBegin) {
            // copy construct items in reverse order at the begin
            Q_ASSERT(this->freeSpaceAtBegin() >= n);
            while (n--) {
                new (this->begin() - 1) T(copy);
                --this->ptr;
                ++this->size;
            }
        } else {
            Inserter(this, i, n).insertFill(copy, n);
        }
    }